

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardShapes.cpp
# Opt level: O1

void Assimp::StandardShapes::MakeSphere
               (uint tess,vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *positions)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  
  if (tess == 0) {
    uVar3 = 0x3c;
  }
  else {
    iVar1 = 1;
    uVar2 = tess;
    do {
      iVar4 = iVar1;
      uVar2 = uVar2 - 1;
      iVar1 = iVar4 * 4;
    } while (uVar2 != 0);
    uVar3 = (ulong)(uint)(iVar4 * 0xf0);
  }
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
            (positions,
             ((long)(positions->
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(positions->
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 + uVar3);
  MakeIcosahedron(positions);
  if (tess != 0) {
    do {
      Subdivide(positions);
      tess = tess - 1;
    } while (tess != 0);
  }
  return;
}

Assistant:

void StandardShapes::MakeSphere(unsigned int    tess,
    std::vector<aiVector3D>& positions)
{
    // Reserve enough storage. Every subdivision
    // splits each triangle in 4, the icosahedron consists of 60 verts
    positions.reserve(positions.size()+60 * integer_pow(4, tess));

    // Construct an icosahedron to start with
    MakeIcosahedron(positions);

    // ... and subdivide it until the requested output
    // tessellation is reached
    for (unsigned int i = 0; i<tess;++i)
        Subdivide(positions);
}